

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O2

void __thiscall
cfd::core::Address::Address
          (Address *this,NetType_conflict type,WitnessVersion witness_ver,TaprootScriptTree *tree,
          SchnorrPubkey *internal_pubkey,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *network_parameters)

{
  AddressFormatData *__return_storage_ptr__;
  NetType_conflict NVar1;
  string sStack_98;
  SchnorrPubkey *local_78;
  Script *local_70;
  TaprootScriptTree *local_68;
  Pubkey *local_60;
  ByteData *local_58;
  string *local_50;
  CfdSourceLocation local_48;
  
  this->type_ = type;
  this->addr_type_ = kTaprootAddress;
  this->witness_ver_ = witness_ver;
  ::std::__cxx11::string::string((string *)&this->address_,"",(allocator *)&sStack_98);
  local_58 = &this->hash_;
  local_50 = &this->address_;
  ByteData::ByteData(local_58);
  local_60 = &this->pubkey_;
  Pubkey::Pubkey(local_60);
  local_78 = &this->schnorr_pubkey_;
  SchnorrPubkey::SchnorrPubkey(local_78);
  local_68 = &this->script_tree_;
  TaprootScriptTree::TaprootScriptTree(local_68,tree);
  local_70 = &this->redeem_script_;
  Script::Script(local_70);
  __return_storage_ptr__ = &this->format_data_;
  GetTargetFormatData(__return_storage_ptr__,network_parameters,type);
  this->checksum_[0] = '\0';
  this->checksum_[1] = '\0';
  this->checksum_[2] = '\0';
  this->checksum_[3] = '\0';
  NVar1 = AddressFormatData::GetNetType(__return_storage_ptr__);
  this->type_ = NVar1;
  TapBranch::GetTweakedPubkey
            ((SchnorrPubkey *)&sStack_98,&tree->super_TapBranch,internal_pubkey,(bool *)0x0);
  ByteData256::operator=(&local_78->data_,(ByteData256 *)&sStack_98);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sStack_98);
  AddressFormatData::GetBech32Hrp_abi_cxx11_(&sStack_98,__return_storage_ptr__);
  CalculateTaproot(this,&sStack_98);
  ::std::__cxx11::string::~string((string *)&sStack_98);
  local_48.filename = "cfdcore_address.cpp";
  local_48.line = 0x330;
  local_48.funcname = "Address";
  AddressFormatData::GetBech32Hrp_abi_cxx11_(&sStack_98,__return_storage_ptr__);
  logger::info<cfd::core::NetType&,cfd::core::AddressType&,std::__cxx11::string>
            (&local_48,"call Address({},{},{})",&this->type_,&this->addr_type_,&sStack_98);
  ::std::__cxx11::string::~string((string *)&sStack_98);
  return;
}

Assistant:

Address::Address(
    NetType type, WitnessVersion witness_ver, const TaprootScriptTree& tree,
    const SchnorrPubkey& internal_pubkey,
    const std::vector<AddressFormatData>& network_parameters)
    : type_(type),
      addr_type_(AddressType::kTaprootAddress),
      witness_ver_(witness_ver),
      address_(""),
      hash_(),
      pubkey_(),
      schnorr_pubkey_(),
      script_tree_(tree),
      redeem_script_(),
      format_data_(GetTargetFormatData(network_parameters, type)) {
  memset(checksum_, 0, sizeof(checksum_));
  SetNetType(format_data_);
  schnorr_pubkey_ = tree.GetTweakedPubkey(internal_pubkey);
  CalculateTaproot(format_data_.GetBech32Hrp());
  info(
      CFD_LOG_SOURCE, "call Address({},{},{})", type_, addr_type_,
      format_data_.GetBech32Hrp());
}